

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.hpp
# Opt level: O3

int njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int in_EAX;
  undefined8 *puVar1;
  
  if ((int)ctx == 0x12) {
    return in_EAX;
  }
  tools::Log::error<char_const*>("Encountered illegal NPL value");
  tools::Log::info<char_const*>("NPL must be equal to 18");
  tools::Log::info<char_const*,int>("NPL value: {}",(int)ctx);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void verify( int NPL ) {

  if ( NPL != 18 ) {

    Log::error( "Encountered illegal NPL value" );
    Log::info( "NPL must be equal to 18" );
    Log::info( "NPL value: {}", NPL );
    throw std::exception();
  }
}